

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *ttf_data;
  long lVar1;
  ImFont *pIVar2;
  ulong uVar3;
  uchar *puVar4;
  ushort *puVar5;
  ushort *puVar6;
  byte bVar7;
  uint uVar8;
  ImFontConfig *pIVar9;
  uint ttf_size;
  byte bVar10;
  ImFontConfig local_a8;
  
  bVar10 = 0;
  uVar8 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar8 = *compressed_ttf_data;
  if (((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18) !=
       0x57bc0000) ||
     (uVar8 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar8 >> 0x18 != 0 || (uVar8 & 0xff0000) != 0) || (uVar8 & 0xff00) != 0) ||
     (uVar8 & 0xff) != 0)) {
LAB_00187e49:
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_a8.FontData = (void *)0x0;
      local_a8.FontDataSize = 0;
      local_a8.FontNo = 0;
      local_a8.SizePixels = 0.0;
      local_a8.OversampleH = 3;
      local_a8.OversampleV = 1;
      local_a8.PixelSnapH = false;
      local_a8.GlyphRanges = (ImWchar *)0x0;
      local_a8.MergeMode = false;
      local_a8.RasterizerFlags = 0;
      local_a8.RasterizerMultiply = 1.0;
      local_a8.GlyphExtraSpacing.x = 0.0;
      local_a8.GlyphExtraSpacing.y = 0.0;
      local_a8.GlyphOffset.x = 0.0;
      local_a8.GlyphOffset.y = 0.0;
      local_a8.Name[0] = '\0';
      local_a8.Name[1] = '\0';
      local_a8.Name[2] = '\0';
      local_a8.Name[3] = '\0';
      local_a8.Name[4] = '\0';
      local_a8.Name[5] = '\0';
      local_a8.Name[6] = '\0';
      local_a8.Name[7] = '\0';
      local_a8.Name[8] = '\0';
      local_a8.Name[9] = '\0';
      local_a8.Name[10] = '\0';
      local_a8.Name[0xb] = '\0';
      local_a8.Name[0xc] = '\0';
      local_a8.Name[0xd] = '\0';
      local_a8.Name[0xe] = '\0';
      local_a8.Name[0xf] = '\0';
      local_a8.Name[0x10] = '\0';
      local_a8.Name[0x11] = '\0';
      local_a8.Name[0x12] = '\0';
      local_a8.Name[0x13] = '\0';
      local_a8.Name[0x14] = '\0';
      local_a8.Name[0x15] = '\0';
      local_a8.Name[0x16] = '\0';
      local_a8.Name[0x17] = '\0';
      local_a8.Name[0x18] = '\0';
      local_a8.Name[0x19] = '\0';
      local_a8.Name[0x1a] = '\0';
      local_a8.Name[0x1b] = '\0';
      local_a8.Name[0x1c] = '\0';
      local_a8.Name[0x1d] = '\0';
      local_a8.Name[0x1e] = '\0';
      local_a8.Name[0x1f] = '\0';
      local_a8.DstFont = (ImFont *)0x0;
    }
    else {
      pIVar9 = &local_a8;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        pIVar9->FontData = font_cfg_template->FontData;
        font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar10 * -0x10 + 8);
        pIVar9 = (ImFontConfig *)((long)pIVar9 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      if (local_a8.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                      ,0x518,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_a8.FontDataOwnedByAtlas = true;
    pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_a8,glyph_ranges);
    return pIVar2;
  }
  uVar8 = *(uint *)((long)compressed_ttf_data + 8);
  stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
  puVar4 = ttf_data +
           (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
  puVar5 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier2 = (uchar *)compressed_ttf_data;
  stb__barrier = puVar4;
  stb__barrier4 = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar7 = (byte)*puVar5;
    uVar8 = (uint)bVar7;
    if (bVar7 < 0x20) {
      if (bVar7 < 0x18) {
        if (bVar7 < 0x10) {
          if (bVar7 < 8) {
            if (bVar7 != 4) {
              if (uVar8 == 6) {
                uVar3 = ~((ulong)*(byte *)((long)puVar5 + 3) |
                          (ulong)*(byte *)((long)puVar5 + 1) << 0x10 | (ulong)(byte)puVar5[1] << 8);
                uVar8 = (uint)(byte)puVar5[2];
                goto LAB_00187cef;
              }
              if (uVar8 == 7) {
                stb__lit((byte *)((long)puVar5 + 3),
                         (ushort)(*(ushort *)((long)puVar5 + 1) << 8 |
                                 *(ushort *)((long)puVar5 + 1) >> 8) + 1);
                uVar3 = (ulong)(ushort)(*(ushort *)((long)puVar5 + 1) << 8 |
                                       *(ushort *)((long)puVar5 + 1) >> 8);
                lVar1 = 4;
                goto LAB_00187da1;
              }
              goto LAB_00187e28;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar5 + 3) |
                         (ulong)*(byte *)((long)puVar5 + 1) << 0x10 | (ulong)(byte)puVar5[1] << 8),
                       (ushort)(puVar5[2] << 8 | puVar5[2] >> 8) + 1);
            puVar6 = puVar5 + 3;
          }
          else {
            stb__lit((uchar *)(puVar5 + 1),
                     ((uint)bVar7 * 0x100 + (uint)*(byte *)((long)puVar5 + 1)) - 0x7ff);
            uVar3 = (ulong)(ushort)(*puVar5 << 8 | *puVar5 >> 8);
            lVar1 = -0x7fd;
LAB_00187da1:
            puVar6 = (ushort *)((long)puVar5 + uVar3 + lVar1);
            if (puVar6 == puVar5) {
              bVar7 = (byte)*puVar5;
LAB_00187e28:
              if ((bVar7 != 5) || (*(byte *)((long)puVar5 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                              ,0x9d1,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar4) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                              ,0x9cb,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00187e49;
            }
          }
        }
        else {
          uVar3 = -(ulong)(((uint)*(byte *)((long)puVar5 + 1) * 0x100 +
                           ((uint)(byte)puVar5[1] | (uint)bVar7 << 0x10)) - 0xfffff);
          uVar8 = (uint)(ushort)(*(ushort *)((long)puVar5 + 3) << 8 |
                                *(ushort *)((long)puVar5 + 3) >> 8);
LAB_00187cef:
          stb__match(stb__dout + uVar3,uVar8 + 1);
          puVar6 = (ushort *)((long)puVar5 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar5 + 1) * 0x100 +
                            ((uint)(byte)puVar5[1] | (uint)bVar7 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar5 + 3) + 1);
        puVar6 = puVar5 + 2;
      }
    }
    else if ((char)bVar7 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar5 + 1),uVar8 - 0x7f);
      puVar6 = puVar5 + 1;
    }
    else {
      if (bVar7 < 0x40) {
        stb__lit((byte *)((long)puVar5 + 1),uVar8 - 0x1f);
        uVar3 = (ulong)(byte)*puVar5;
        lVar1 = -0x1e;
        goto LAB_00187da1;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar5 + 1) + (uint)bVar7 * 0x100) - 0x3fff),
                 (byte)puVar5[1] + 1);
      puVar6 = (ushort *)((long)puVar5 + 3);
    }
    puVar5 = puVar6;
    if (puVar4 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                    ,0x9d5,
                    "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}